

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

void __thiscall
fakeit::RecordedMethodBody<unsigned_long>::~RecordedMethodBody
          (RecordedMethodBody<unsigned_long> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_MethodInvocationHandler<unsigned_long>).super_Destructible._vptr_Destructible =
       (_func_int **)&PTR__RecordedMethodBody_0012e938;
  (this->super_ActualInvocationsSource)._vptr_ActualInvocationsSource = (_func_int **)&DAT_0012e970;
  (this->super_ActualInvocationsContainer)._vptr_ActualInvocationsContainer =
       (_func_int **)&PTR_clear_0012e998;
  std::
  vector<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
  ::~vector(&this->_actualInvocations);
  std::
  vector<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
  ::~vector(&this->_invocationHandlers);
  pcVar1 = (this->_method)._name._M_dataplus._M_p;
  paVar2 = &(this->_method)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~RecordedMethodBody() NO_THROWS {
        }